

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O1

Aig_Obj_t ** Aig_ManStaticFanoutStart(Aig_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  Aig_Obj_t **ppAVar3;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = p->vObjs->nSize * 2 - (p->nObjs[2] + p->nObjs[3]);
  ppAVar3 = (Aig_Obj_t **)malloc((long)iVar7 << 3);
  pVVar6 = p->vObjs;
  if (pVVar6->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar5];
      if (pvVar1 != (void *)0x0) {
        *(Aig_Obj_t ***)((long)pvVar1 + 0x28) = ppAVar3 + iVar4;
        iVar4 = iVar4 + ((uint)(*(ulong *)((long)pvVar1 + 0x18) >> 6) & 0x3ffffff);
        *(ulong *)((long)pvVar1 + 0x18) = *(ulong *)((long)pvVar1 + 0x18) & 0xffffffff0000003f;
      }
      lVar5 = lVar5 + 1;
      pVVar6 = p->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  if (iVar7 <= iVar4) {
    __assert_fail("nFanouts < nFanoutsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetFwd.c"
                  ,0x42,"Aig_Obj_t **Aig_ManStaticFanoutStart(Aig_Man_t *)");
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar5];
      if (pvVar1 != (void *)0x0) {
        if (*(ulong *)((long)pvVar1 + 8) != 0) {
          uVar8 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          uVar2 = *(ulong *)(uVar8 + 0x18);
          *(ulong *)(uVar8 + 0x18) =
               uVar2 & 0xffffffff0000003f | (ulong)((int)uVar2 + 0x40U & 0xffffffc0);
          *(void **)(*(long *)(uVar8 + 0x28) + (uVar2 >> 6 & 0x3ffffff) * 8) = pvVar1;
        }
        if (*(ulong *)((long)pvVar1 + 0x10) != 0) {
          uVar8 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
          uVar2 = *(ulong *)(uVar8 + 0x18);
          *(ulong *)(uVar8 + 0x18) =
               uVar2 & 0xffffffff0000003f | (ulong)((int)uVar2 + 0x40U & 0xffffffc0);
          *(void **)(*(long *)(uVar8 + 0x28) + (uVar2 >> 6 & 0x3ffffff) * 8) = pvVar1;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar6 = p->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  return ppAVar3;
}

Assistant:

Aig_Obj_t ** Aig_ManStaticFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t ** ppFanouts, * pObj;
    int i, nFanouts, nFanoutsAlloc;
    // allocate fanouts
    nFanoutsAlloc = 2 * Aig_ManObjNumMax(p) - Aig_ManCiNum(p) - Aig_ManCoNum(p);
    ppFanouts = ABC_ALLOC( Aig_Obj_t *, nFanoutsAlloc );
    // mark up storage
    nFanouts = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->pData = ppFanouts + nFanouts;
        nFanouts += pObj->nRefs;  
        pObj->nRefs = 0;
    }
    assert( nFanouts < nFanoutsAlloc ); 
    // add fanouts
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin1(pObj), pObj );
    }
    return ppFanouts;
}